

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache.c
# Opt level: O0

int vmemcache_put(VMEMcache *cache,void *key,size_t ksize,void *value,size_t value_size)

{
  int iVar1;
  long *plVar2;
  int *piVar3;
  ulong local_60;
  ssize_t allocated;
  size_t left_to_allocate;
  ptr_ext_t *small_extent;
  cache_entry *entry;
  size_t value_size_local;
  void *value_local;
  size_t ksize_local;
  void *key_local;
  VMEMcache *cache_local;
  
  entry = (cache_entry *)value_size;
  value_size_local = (size_t)value;
  value_local = (void *)ksize;
  ksize_local = (size_t)key;
  key_local = cache;
  plVar2 = (long *)__tls_get_addr(&PTR_0010dfc0);
  if (*plVar2 != 0) {
    vmemcache_put_satisfy_get
              ((void *)ksize_local,(size_t)value_local,(void *)value_size_local,(size_t)entry);
  }
  if (*(cache_entry **)((long)key_local + 8) < entry) {
    out_err("/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/src/vmemcache.c",
            0x152,"vmemcache_put","value larger than entire cache");
    piVar3 = __errno_location();
    *piVar3 = 0x1c;
    cache_local._4_4_ = -1;
  }
  else {
    small_extent = (ptr_ext_t *)Zalloc((long)value_local + 0x28);
    if (small_extent == (ptr_ext_t *)0x0) {
      out_err("/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/src/vmemcache.c",
              0x15b,"vmemcache_put","!Zalloc");
      cache_local._4_4_ = -1;
    }
    else {
      *(void **)(small_extent + 0x20) = value_local;
      memcpy(small_extent + 0x28,(void *)ksize_local,(size_t)value_local);
      if (((*(byte *)((long)key_local + 0x58) >> 1 & 1) == 0) &&
         ((*(byte *)((long)key_local + 0x58) >> 2 & 1) == 0)) {
        left_to_allocate = 0;
        for (allocated = (ssize_t)entry; allocated != 0; allocated = allocated - local_60) {
          local_60 = vmcache_alloc(*(heap **)((long)key_local + 0x18),allocated,
                                   (ptr_ext_t **)(small_extent + 0x18),
                                   (ptr_ext_t **)&left_to_allocate);
          if ((long)local_60 < 0) goto LAB_001062c0;
          if ((local_60 == 0) &&
             (iVar1 = vmemcache_evict((VMEMcache *)key_local,(void *)0x0,0), iVar1 != 0)) {
            piVar3 = __errno_location();
            if (*piVar3 == 3) {
              piVar3 = __errno_location();
              *piVar3 = 0x1c;
            }
            goto LAB_001062c0;
          }
          if ((ulong)allocated <= local_60) {
            local_60 = allocated;
          }
        }
        if ((*(byte *)((long)key_local + 0x58) >> 3 & 1) == 0) {
          vmemcache_populate_extents
                    ((cache_entry *)small_extent,(void *)value_size_local,(size_t)entry);
        }
        else {
          *(cache_entry **)(small_extent + 0x10) = entry;
        }
      }
      iVar1 = vmcache_index_insert(*(index **)((long)key_local + 0x20),(cache_entry *)small_extent);
      if (iVar1 == 0) {
        if ((*(byte *)((long)key_local + 0x58) >> 1 & 1) == 0) {
          (**(code **)(**(long **)((long)key_local + 0x30) + 0x10))
                    (*(undefined8 *)(*(long *)((long)key_local + 0x30) + 8),small_extent,
                     small_extent + 8);
        }
        cache_local._4_4_ = 0;
      }
      else {
LAB_001062c0:
        vmcache_free(*(heap **)((long)key_local + 0x18),*(ptr_ext_t **)(small_extent + 0x18));
        free(small_extent);
        cache_local._4_4_ = -1;
      }
    }
  }
  return cache_local._4_4_;
}

Assistant:

int
vmemcache_put(VMEMcache *cache, const void *key, size_t ksize,
				const void *value, size_t value_size)
{
	LOG(3, "cache %p key %p ksize %zu value %p value_size %zu",
		cache, key, ksize, value, value_size);

	if (get_req.key)
		vmemcache_put_satisfy_get(key, ksize, value, value_size);

	if (value_size > cache->size) {
		ERR("value larger than entire cache");
		errno = ENOSPC;
		return -1;
	}

	struct cache_entry *entry;

	entry = Zalloc(sizeof(struct cache_entry) + ksize);
	if (entry == NULL) {
		ERR("!Zalloc");
		return -1;
	}

	entry->key.ksize = ksize;
	memcpy(entry->key.key, key, ksize);

	if (cache->index_only || cache->no_alloc)
		goto put_index;

	ptr_ext_t *small_extent = NULL; /* required by vmcache_alloc() */
	size_t left_to_allocate = value_size;

	while (left_to_allocate != 0) {
		ssize_t allocated = vmcache_alloc(cache->heap, left_to_allocate,
							&entry->value.extents,
							&small_extent);
		if (allocated < 0)
			goto error_exit;

		if (allocated == 0 && vmemcache_evict(cache, NULL, 0)) {
			LOG(1, "vmemcache_evict() failed");
			if (errno == ESRCH)
				errno = ENOSPC;
			goto error_exit;
		}

		left_to_allocate -= MIN((size_t)allocated, left_to_allocate);
	}

	if (cache->no_memcpy)
		entry->value.vsize = value_size;
	else
		vmemcache_populate_extents(entry, value, value_size);

put_index:
	if (vmcache_index_insert(cache->index, entry)) {
		LOG(1, "inserting to the index failed");
		goto error_exit;
	}

	if (!cache->index_only) {
		cache->repl->ops->repl_p_insert(cache->repl->head, entry,
					&entry->value.p_entry);
	}

	return 0;

error_exit:
	vmcache_free(cache->heap, entry->value.extents);

	Free(entry);

	return -1;
}